

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O2

bool Grammar::is_keyword_message(string *str)

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  int i;
  long lVar4;
  string local_90;
  string local_70;
  string local_50;
  
  bVar1 = is_keyword_message_part(str);
  bVar3 = true;
  if (!bVar1) {
    lVar4 = 0;
    while( true ) {
      lVar2 = (long)(int)str->_M_string_length;
      bVar3 = lVar4 < lVar2;
      if (lVar2 <= lVar4) break;
      bVar1 = str_utils::is_space((str->_M_dataplus)._M_p[lVar4]);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)&local_90,(ulong)str);
        bVar1 = is_keyword_message_part(&local_90);
        if (bVar1) {
          std::__cxx11::string::substr((ulong)&local_70,(ulong)str);
          str_utils::ltrim(&local_50,&local_70);
          bVar1 = is_keyword_message(&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          if (bVar1) {
            return bVar3;
          }
        }
        else {
          std::__cxx11::string::~string((string *)&local_90);
        }
      }
      lVar4 = lVar4 + 1;
    }
  }
  return bVar3;
}

Assistant:

bool Grammar::is_keyword_message(const std::string& str) {
    if (is_keyword_message_part(str))
        return true;
    for (int i = 0; i < int(str.size()); i++)
        if (str_utils::is_space(str[i]) && is_keyword_message_part(str.substr(0, i)) &&
            is_keyword_message(str_utils::ltrim(str.substr(i + 1))))
            return true;
    return false;
}